

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O3

void If_DsdManComputeTruth_rec(If_DsdMan_t *p,int iDsd,word *pRes,uchar *pPermLits,int *pnSupp)

{
  uint uVar1;
  int *piVar2;
  Vec_Mem_t *pVVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  word *pwVar9;
  ulong uVar10;
  ulong uVar11;
  word pTtTemp [64];
  byte local_1844;
  word local_1838 [64];
  ulong auStack_1638 [64];
  ulong auStack_1438 [641];
  
  if (iDsd < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                  ,0x130,"int Abc_LitIsCompl(int)");
  }
  if ((p->vObjs).nSize <= (int)((uint)iDsd >> 1)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  piVar2 = (int *)(p->vObjs).pArray[(uint)iDsd >> 1];
  uVar7 = piVar2[1];
  switch(uVar7 & 7) {
  case 2:
    iVar8 = *pnSupp;
    if (pPermLits == (uchar *)0x0) {
      if (iVar8 < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      uVar7 = iVar8 * 2;
    }
    else {
      uVar7 = (uint)pPermLits[iVar8];
    }
    *pnSupp = iVar8 + 1;
    if (p->nVars <= iVar8) {
      __assert_fail("(*pnSupp) <= p->nVars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                    ,0x555,
                    "void If_DsdManComputeTruth_rec(If_DsdMan_t *, int, word *, unsigned char *, int *)"
                   );
    }
    pwVar9 = p->pTtElems[uVar7 >> 1];
    uVar1 = p->nWords;
    if (((iDsd ^ uVar7) & 1) != 0) {
      if ((int)uVar1 < 1) {
        return;
      }
      uVar11 = 0;
      do {
        pRes[uVar11] = ~pwVar9[uVar11];
        uVar11 = uVar11 + 1;
      } while (uVar1 != uVar11);
      return;
    }
    if ((int)uVar1 < 1) {
      return;
    }
    uVar11 = 0;
    do {
      pRes[uVar11] = pwVar9[uVar11];
      uVar11 = uVar11 + 1;
    } while (uVar1 != uVar11);
    return;
  case 3:
  case 4:
    break;
  case 5:
    if (0x7ffffff < uVar7) {
      pwVar9 = local_1838;
      uVar11 = 0;
      do {
        if (piVar2[uVar11 + 2] == 0) break;
        If_DsdManComputeTruth_rec(p,piVar2[uVar11 + 2],pwVar9,pPermLits,pnSupp);
        uVar11 = uVar11 + 1;
        pwVar9 = pwVar9 + 0x40;
      } while (uVar11 < (uint)piVar2[1] >> 0x1b);
      if ((int)uVar11 == 3) {
        lVar6 = (long)p->nWords;
        if (lVar6 < 1) {
          return;
        }
        lVar5 = 0;
        do {
          pRes[lVar5] = (auStack_1638[lVar5] ^ auStack_1438[lVar5]) & local_1838[lVar5] ^
                        auStack_1438[lVar5];
          lVar5 = lVar5 + 1;
        } while (lVar6 != lVar5);
        if ((iDsd & 1U) == 0) {
          return;
        }
        lVar5 = 0;
        do {
          pRes[lVar5] = ~pRes[lVar5];
          lVar5 = lVar5 + 1;
        } while (lVar6 != lVar5);
        return;
      }
    }
    __assert_fail("i == 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                  ,0x570,
                  "void If_DsdManComputeTruth_rec(If_DsdMan_t *, int, word *, unsigned char *, int *)"
                 );
  case 6:
    if (0x7ffffff < uVar7) {
      iVar8 = piVar2[2];
      if (iVar8 == 0) {
        uVar11 = (ulong)(uVar7 >> 0x1b);
      }
      else {
        uVar10 = 1;
        pwVar9 = local_1838;
        do {
          If_DsdManComputeTruth_rec(p,iVar8,pwVar9,pPermLits,pnSupp);
          uVar7 = piVar2[1];
          uVar11 = (ulong)(uVar7 >> 0x1b);
          if (uVar11 <= uVar10) break;
          iVar8 = piVar2[uVar10 + 2];
          uVar10 = uVar10 + 1;
          pwVar9 = pwVar9 + 0x40;
        } while (iVar8 != 0);
      }
      if ((0x17ffffff < uVar7) && ((uVar7 & 7) == 6)) {
        iVar8 = *piVar2;
        if (((long)iVar8 < 0) || ((p->vTruths).nSize <= iVar8)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar7 = (p->vTruths).pArray[iVar8];
        if ((-1 < (int)uVar7) && (pVVar3 = p->vTtMem[uVar11], (int)uVar7 < pVVar3->nEntries)) {
          Dau_DsdTruthCompose_rec
                    (pVVar3->ppPages[uVar7 >> ((byte)pVVar3->LogPageSze & 0x1f)] +
                     (long)(int)(pVVar3->PageMask & uVar7) * (long)pVVar3->nEntrySize,&local_1838,
                     pRes,(int)uVar11,p->nWords);
          if ((iDsd & 1U) == 0) {
            return;
          }
          iVar8 = p->nWords;
          if ((long)iVar8 < 1) {
            return;
          }
          lVar6 = 0;
          do {
            pRes[lVar6] = ~pRes[lVar6];
            lVar6 = lVar6 + 1;
          } while (iVar8 != lVar6);
          return;
        }
      }
    }
    __assert_fail("i >= 0 && i < p->nEntries",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                  ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                  ,0x57e,
                  "void If_DsdManComputeTruth_rec(If_DsdMan_t *, int, word *, unsigned char *, int *)"
                 );
  }
  uVar1 = p->nWords;
  uVar11 = (ulong)uVar1;
  if ((uVar7 & 7) == 3) {
    if ((int)uVar1 < 1) goto LAB_0042a3a1;
    iVar8 = 0xff;
  }
  else {
    if ((int)uVar1 < 1) goto LAB_0042a3a1;
    iVar8 = 0;
  }
  memset(pRes,iVar8,uVar11 * 8);
LAB_0042a3a1:
  if ((0x7ffffff < (uint)piVar2[1]) && (iVar8 = piVar2[2], iVar8 != 0)) {
    uVar10 = 0;
    do {
      If_DsdManComputeTruth_rec(p,iVar8,local_1838,pPermLits,pnSupp);
      uVar7 = p->nWords;
      uVar11 = (ulong)uVar7;
      if ((piVar2[1] & 7U) == 3) {
        if (0 < (int)uVar7) {
          uVar4 = 0;
          do {
            pRes[uVar4] = pRes[uVar4] & local_1838[uVar4];
            uVar4 = uVar4 + 1;
          } while (uVar11 != uVar4);
        }
      }
      else if (0 < (int)uVar7) {
        uVar4 = 0;
        do {
          pRes[uVar4] = pRes[uVar4] ^ local_1838[uVar4];
          uVar4 = uVar4 + 1;
        } while (uVar11 != uVar4);
      }
    } while ((uVar10 + 1 < (ulong)((uint)piVar2[1] >> 0x1b)) &&
            (iVar8 = piVar2[uVar10 + 3], uVar10 = uVar10 + 1, iVar8 != 0));
  }
  local_1844 = (byte)iDsd;
  if ((0 < (int)uVar11 & local_1844) == 1) {
    uVar10 = 0;
    do {
      pRes[uVar10] = ~pRes[uVar10];
      uVar10 = uVar10 + 1;
    } while (uVar11 != uVar10);
  }
  return;
}

Assistant:

void If_DsdManComputeTruth_rec( If_DsdMan_t * p, int iDsd, word * pRes, unsigned char * pPermLits, int * pnSupp )
{
    int i, iFanin, fCompl = Abc_LitIsCompl(iDsd);
    If_DsdObj_t * pObj = If_DsdVecObj( &p->vObjs, Abc_Lit2Var(iDsd) );
    if ( If_DsdObjType(pObj) == IF_DSD_VAR )
    {
        int iPermLit = pPermLits ? (int)pPermLits[*pnSupp] : Abc_Var2Lit(*pnSupp, 0);
        (*pnSupp)++;
        assert( (*pnSupp) <= p->nVars );
        Abc_TtCopy( pRes, p->pTtElems[Abc_Lit2Var(iPermLit)], p->nWords, fCompl ^ Abc_LitIsCompl(iPermLit) );
        return;
    }
    if ( If_DsdObjType(pObj) == IF_DSD_AND || If_DsdObjType(pObj) == IF_DSD_XOR )
    {
        word pTtTemp[DAU_MAX_WORD];
        if ( If_DsdObjType(pObj) == IF_DSD_AND )
            Abc_TtConst1( pRes, p->nWords );
        else
            Abc_TtConst0( pRes, p->nWords );
        If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
        {
            If_DsdManComputeTruth_rec( p, iFanin, pTtTemp, pPermLits, pnSupp );
            if ( If_DsdObjType(pObj) == IF_DSD_AND )
                Abc_TtAnd( pRes, pRes, pTtTemp, p->nWords, 0 );
            else
                Abc_TtXor( pRes, pRes, pTtTemp, p->nWords, 0 );
        }
        if ( fCompl ) Abc_TtNot( pRes, p->nWords );
        return;
    }
    if ( If_DsdObjType(pObj) == IF_DSD_MUX ) // mux
    {
        word pTtTemp[3][DAU_MAX_WORD];
        If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
            If_DsdManComputeTruth_rec( p, iFanin, pTtTemp[i], pPermLits, pnSupp );
        assert( i == 3 );
        Abc_TtMux( pRes, pTtTemp[0], pTtTemp[1], pTtTemp[2], p->nWords );
        if ( fCompl ) Abc_TtNot( pRes, p->nWords );
        return;
    }
    if ( If_DsdObjType(pObj) == IF_DSD_PRIME ) // function
    {
        word pFanins[DAU_MAX_VAR][DAU_MAX_WORD];
        If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
            If_DsdManComputeTruth_rec( p, iFanin, pFanins[i], pPermLits, pnSupp );
        Dau_DsdTruthCompose_rec( If_DsdObjTruth(p, pObj), pFanins, pRes, pObj->nFans, p->nWords );
        if ( fCompl ) Abc_TtNot( pRes, p->nWords );
        return;
    }
    assert( 0 );

}